

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O1

void __thiscall
SpeciesTracker::IncrementRibo(SpeciesTracker *this,string *transcript_name,int copy_number)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  const_iterator cVar1;
  mapped_type_conflict *pmVar2;
  runtime_error *this_01;
  mapped_type_conflict mVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->ribo_per_transcript_;
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&this_00->_M_t,transcript_name);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](this_00,transcript_name);
  mVar3 = 0;
  if ((_Rb_tree_header *)cVar1._M_node !=
      &(this->ribo_per_transcript_)._M_t._M_impl.super__Rb_tree_header) {
    mVar3 = *pmVar2;
  }
  *pmVar2 = mVar3 + copy_number;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](this_00,transcript_name);
  if (-1 < *pmVar2) {
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Ribosome count less than 0.",transcript_name);
  std::runtime_error::runtime_error(this_01,(string *)&local_50);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SpeciesTracker::IncrementRibo(const std::string &transcript_name,
                                   int copy_number) {
  if (ribo_per_transcript_.count(transcript_name) == 0) {
    ribo_per_transcript_[transcript_name] = copy_number;
  } else {
    ribo_per_transcript_[transcript_name] += copy_number;
  }
  if (ribo_per_transcript_[transcript_name] < 0) {
    throw std::runtime_error("Ribosome count less than 0." + transcript_name);
  }
}